

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portal.cpp
# Opt level: O0

bool ChangePortalLine(line_t *line,int destid)

{
  uint uVar1;
  uint uVar2;
  FLinePortal *port_00;
  line_t *plVar3;
  FLinePortal *port_01;
  FLinePortal *portd;
  FLinePortal *port;
  int destid_local;
  line_t *line_local;
  
  uVar1 = line->portalindex;
  uVar2 = TArray<FLinePortal,_FLinePortal>::Size(&linePortals);
  if (uVar1 < uVar2) {
    port_00 = TArray<FLinePortal,_FLinePortal>::operator[](&linePortals,(ulong)line->portalindex);
    if (port_00->mType == '\x03') {
      line_local._7_1_ = false;
    }
    else {
      if (destid == 0) {
        port_00->mDestination = (line_t *)0x0;
      }
      plVar3 = FindDestination(line,destid);
      port_00->mDestination = plVar3;
      if (port_00->mDestination == (line_t *)0x0) {
        port_00->mFlags = '\0';
      }
      else if (port_00->mType == '\x02') {
        port_01 = TArray<FLinePortal,_FLinePortal>::operator[]
                            (&linePortals,(ulong)port_00->mDestination->portalindex);
        if (((port_01 == (FLinePortal *)0x0) || (port_01->mType != '\x02')) ||
           (port_01->mDestination != line)) {
          port_00->mFlags = port_00->mDefFlags;
        }
        else {
          port_00->mFlags = port_00->mDefFlags | 8;
          port_01->mFlags = port_01->mDefFlags | 8;
        }
        SetRotation(port_01);
      }
      SetRotation(port_00);
      line_local._7_1_ = true;
    }
  }
  else {
    line_local._7_1_ = false;
  }
  return line_local._7_1_;
}

Assistant:

static bool ChangePortalLine(line_t *line, int destid)
{
	if (line->portalindex >= linePortals.Size()) return false;
	FLinePortal *port = &linePortals[line->portalindex];
	if (port->mType == PORTT_LINKED) return false;	// linked portals cannot be changed.
	if (destid == 0) port->mDestination = NULL;
	port->mDestination = FindDestination(line, destid);
	if (port->mDestination == NULL)
	{
		port->mFlags = 0;
	}
	else if (port->mType == PORTT_INTERACTIVE)
	{
		FLinePortal *portd = &linePortals[port->mDestination->portalindex];
		if (portd != NULL && portd->mType == PORTT_INTERACTIVE && portd->mDestination == line)
		{
			// this is a 2-way interactive portal
			port->mFlags = port->mDefFlags | PORTF_INTERACTIVE;
			portd->mFlags = portd->mDefFlags | PORTF_INTERACTIVE;
		}
		else
		{
			port->mFlags = port->mDefFlags;
		}
		SetRotation(portd);
	}
	SetRotation(port);
	return true;
}